

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O2

FOptionMenuItem * __thiscall DOptionMenu::GetItem(DOptionMenu *this,FName *name)

{
  FOptionMenuItem *pFVar1;
  uint i;
  ulong uVar2;
  FName nm;
  int local_2c;
  
  uVar2 = 0;
  while( true ) {
    if ((this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count <= uVar2) {
      return (FOptionMenuItem *)0x0;
    }
    pFVar1 = (this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar2];
    (*(pFVar1->super_FListMenuItem)._vptr_FListMenuItem[7])(&local_2c,pFVar1,0);
    if (local_2c == name->Index) break;
    uVar2 = uVar2 + 1;
  }
  return (this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar2];
}

Assistant:

FOptionMenuItem *DOptionMenu::GetItem(FName name)
{
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		FName nm = mDesc->mItems[i]->GetAction(NULL);
		if (nm == name) return mDesc->mItems[i];
	}
	return NULL;
}